

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

PCMSegment *
Storage::Encodings::AppleGCR::five_and_three_data
          (PCMSegment *__return_storage_ptr__,uint8_t *source)

{
  long lVar1;
  allocator_type local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&data,0x1a1,&local_29);
  *data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0xd5;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0xaa;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0xad;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19e] = 0xde;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19b] = 0xaa;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a0] = 0xeb;
  for (lVar1 = 3; lVar1 != 0x19d; lVar1 = lVar1 + 1) {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[lVar1] =
         (anonymous_namespace)::five_and_three_mapping
         [data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar1]];
  }
  Disk::PCMSegment::PCMSegment(__return_storage_ptr__,&data);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

Storage::Disk::PCMSegment AppleGCR::five_and_three_data(const uint8_t *source) {
	std::vector<uint8_t> data(410 + 7);

	data[0] = data_prologue[0];
	data[1] = data_prologue[1];
	data[2] = data_prologue[2];

	data[414] = epilogue[0];
	data[411] = epilogue[1];
	data[416] = epilogue[2];

	// TODO: encode.
	(void)source;

//	std::size_t source_pointer = 0;
//	std::size_t destination_pointer = 3;
//	while(source_pointer < 255) {
//		encode_five_and_three_block(&segment.data[destination_pointer], &source[source_pointer]);
//
//		source_pointer += 5;
//		destination_pointer += 8;
//	}

	// Map five-bit values up to full bytes.
	for(std::size_t c = 0; c < 410; ++c) {
		data[3 + c] = five_and_three_mapping[data[3 + c]];
	}

	return Storage::Disk::PCMSegment(data);
}